

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O0

bool load_model(string *fname,yolo_model *model)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  reference pvVar5;
  size_type sVar6;
  ggml_tensor *pgVar7;
  undefined4 *in_RSI;
  char name_1 [256];
  int i_1;
  size_t n_size;
  ggml_tensor *src_1;
  ggml_tensor *cur;
  ggml_tensor *dst;
  ggml_tensor *src;
  char *name;
  int i;
  ggml_init_params params;
  int num_tensors;
  gguf_context *gguf_ctx;
  gguf_init_params gguf_params;
  ggml_context *tmp_ctx;
  size_type in_stack_fffffffffffffdf8;
  vector<conv2d_layer,_std::allocator<conv2d_layer>_> *in_stack_fffffffffffffe00;
  char local_1c8 [268];
  uint local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  int local_84;
  long local_80;
  undefined8 local_78;
  undefined8 local_70;
  long local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  int local_4c;
  undefined8 local_48;
  undefined8 *local_40;
  long local_38;
  undefined1 local_30;
  undefined7 uStack_2f;
  undefined8 *local_28;
  undefined8 local_20;
  undefined4 *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  if (*(long *)(in_RSI + 8) == 0) {
    uVar3 = ggml_backend_cpu_init();
    *(undefined8 *)(local_18 + 8) = uVar3;
  }
  local_20 = 0;
  local_30 = 0;
  local_28 = &local_20;
  uVar3 = std::__cxx11::string::c_str();
  local_48 = CONCAT71(uStack_2f,local_30);
  local_40 = local_28;
  local_38 = gguf_init_from_file(uVar3,local_30,local_28);
  if (local_38 == 0) {
    fprintf(_stderr,"%s: gguf_init_from_file() failed\n","load_model");
    local_1 = false;
  }
  else {
    local_4c = gguf_get_n_tensors(local_38);
    local_80 = ggml_tensor_overhead();
    local_80 = local_80 * local_4c;
    local_60 = 0;
    local_58 = 1;
    local_78 = 0;
    local_70 = CONCAT71(uStack_57,1);
    local_68 = local_80;
    uVar3 = ggml_init();
    *(undefined8 *)(local_18 + 0xc) = uVar3;
    for (local_84 = 0; local_84 < local_4c; local_84 = local_84 + 1) {
      local_90 = gguf_get_tensor_name(local_38,(long)local_84);
      local_98 = ggml_get_tensor(local_20,local_90);
      local_a0 = ggml_dup_tensor(*(undefined8 *)(local_18 + 0xc),local_98);
      ggml_set_name(local_a0,local_90);
    }
    uVar3 = ggml_backend_alloc_ctx_tensors
                      (*(undefined8 *)(local_18 + 0xc),*(undefined8 *)(local_18 + 8));
    *(undefined8 *)(local_18 + 10) = uVar3;
    for (local_a8 = ggml_get_first_tensor(*(undefined8 *)(local_18 + 0xc)); uVar3 = local_20,
        local_a8 != 0; local_a8 = ggml_get_next_tensor(*(undefined8 *)(local_18 + 0xc),local_a8)) {
      uVar4 = ggml_get_name(local_a8);
      local_b0 = ggml_get_tensor(uVar3,uVar4);
      local_b8 = ggml_nbytes(local_b0);
      lVar2 = local_a8;
      uVar3 = ggml_get_data(local_b0);
      ggml_backend_tensor_set(lVar2,uVar3,0,local_b8);
    }
    gguf_free(local_38);
    *local_18 = 0x1a0;
    local_18[1] = 0x1a0;
    std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::resize
              (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    pvVar5 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::operator[]
                       ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2),7);
    pvVar5->padding = 0;
    pvVar5 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::operator[]
                       ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2),9);
    pvVar5->padding = 0;
    pvVar5 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::operator[]
                       ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2),9);
    pvVar5->batch_normalize = false;
    pvVar5 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::operator[]
                       ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2),9);
    pvVar5->activate = false;
    pvVar5 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::operator[]
                       ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2),10);
    pvVar5->padding = 0;
    pvVar5 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::operator[]
                       ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2),0xc);
    pvVar5->padding = 0;
    pvVar5 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::operator[]
                       ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2),0xc);
    pvVar5->batch_normalize = false;
    pvVar5 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::operator[]
                       ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2),0xc);
    pvVar5->activate = false;
    local_bc = 0;
    while( true ) {
      uVar1 = local_bc;
      sVar6 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::size
                        ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2));
      if ((int)sVar6 <= (int)uVar1) break;
      snprintf(local_1c8,0x100,"l%d_weights",(ulong)local_bc);
      pgVar7 = (ggml_tensor *)ggml_get_tensor(*(undefined8 *)(local_18 + 0xc),local_1c8);
      pvVar5 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::operator[]
                         ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2),
                          (long)(int)local_bc);
      pvVar5->weights = pgVar7;
      snprintf(local_1c8,0x100,"l%d_biases",(ulong)local_bc);
      pgVar7 = (ggml_tensor *)ggml_get_tensor(*(undefined8 *)(local_18 + 0xc),local_1c8);
      pvVar5 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::operator[]
                         ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2),
                          (long)(int)local_bc);
      pvVar5->biases = pgVar7;
      pvVar5 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::operator[]
                         ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2),
                          (long)(int)local_bc);
      if ((pvVar5->batch_normalize & 1U) != 0) {
        snprintf(local_1c8,0x100,"l%d_scales",(ulong)local_bc);
        pgVar7 = (ggml_tensor *)ggml_get_tensor(*(undefined8 *)(local_18 + 0xc),local_1c8);
        pvVar5 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::operator[]
                           ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2),
                            (long)(int)local_bc);
        pvVar5->scales = pgVar7;
        snprintf(local_1c8,0x100,"l%d_rolling_mean",(ulong)local_bc);
        pgVar7 = (ggml_tensor *)ggml_get_tensor(*(undefined8 *)(local_18 + 0xc),local_1c8);
        pvVar5 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::operator[]
                           ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2),
                            (long)(int)local_bc);
        pvVar5->rolling_mean = pgVar7;
        snprintf(local_1c8,0x100,"l%d_rolling_variance",(ulong)local_bc);
        pgVar7 = (ggml_tensor *)ggml_get_tensor(*(undefined8 *)(local_18 + 0xc),local_1c8);
        pvVar5 = std::vector<conv2d_layer,_std::allocator<conv2d_layer>_>::operator[]
                           ((vector<conv2d_layer,_std::allocator<conv2d_layer>_> *)(local_18 + 2),
                            (long)(int)local_bc);
        pvVar5->rolling_variance = pgVar7;
      }
      local_bc = local_bc + 1;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool load_model(const std::string & fname, yolo_model & model) {
    // initialize the backend
#ifdef GGML_USE_CUDA
    fprintf(stderr, "%s: using CUDA backend\n", __func__);
    model.backend = ggml_backend_cuda_init(0); // init device 0
    if (!model.backend) {
        fprintf(stderr, "%s: ggml_backend_cuda_init() failed\n", __func__);
    }
#endif

#ifdef GGML_USE_METAL
    fprintf(stderr, "%s: using Metal backend\n", __func__);
    model.backend = ggml_backend_metal_init();
    if (!model.backend) {
        fprintf(stderr, "%s: ggml_backend_metal_init() failed\n", __func__);
    }
#endif

    // if there aren't GPU Backends fallback to CPU backend
    if (!model.backend) {
        model.backend = ggml_backend_cpu_init();
    }
    struct ggml_context * tmp_ctx = nullptr;
    struct gguf_init_params gguf_params = {
        /*.no_alloc   =*/ false,
        /*.ctx        =*/ &tmp_ctx,
    };
    gguf_context * gguf_ctx = gguf_init_from_file(fname.c_str(), gguf_params);
    if (!gguf_ctx) {
        fprintf(stderr, "%s: gguf_init_from_file() failed\n", __func__);
        return false;
    }

    int num_tensors = gguf_get_n_tensors(gguf_ctx);
    struct ggml_init_params params {
            /*.mem_size   =*/ ggml_tensor_overhead() * num_tensors,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
    };
    model.ctx = ggml_init(params);
    for (int i = 0; i < num_tensors; i++) {
        const char * name = gguf_get_tensor_name(gguf_ctx, i);
        struct ggml_tensor * src = ggml_get_tensor(tmp_ctx, name);
        struct ggml_tensor * dst = ggml_dup_tensor(model.ctx, src);
        ggml_set_name(dst, name);
    }
    model.buffer = ggml_backend_alloc_ctx_tensors(model.ctx, model.backend);
    // copy tensors from main memory to backend
    for (struct ggml_tensor * cur = ggml_get_first_tensor(model.ctx); cur != NULL; cur = ggml_get_next_tensor(model.ctx, cur)) {
        struct ggml_tensor * src = ggml_get_tensor(tmp_ctx, ggml_get_name(cur));
        size_t n_size = ggml_nbytes(src);
        ggml_backend_tensor_set(cur, ggml_get_data(src), 0, n_size);
    }
    gguf_free(gguf_ctx);

    model.width  = 416;
    model.height = 416;
    model.conv2d_layers.resize(13);
    model.conv2d_layers[7].padding = 0;
    model.conv2d_layers[9].padding = 0;
    model.conv2d_layers[9].batch_normalize = false;
    model.conv2d_layers[9].activate = false;
    model.conv2d_layers[10].padding = 0;
    model.conv2d_layers[12].padding = 0;
    model.conv2d_layers[12].batch_normalize = false;
    model.conv2d_layers[12].activate = false;
    for (int i = 0; i < (int)model.conv2d_layers.size(); i++) {
        char name[256];
        snprintf(name, sizeof(name), "l%d_weights", i);
        model.conv2d_layers[i].weights = ggml_get_tensor(model.ctx, name);
        snprintf(name, sizeof(name), "l%d_biases", i);
        model.conv2d_layers[i].biases = ggml_get_tensor(model.ctx, name);
        if (model.conv2d_layers[i].batch_normalize) {
            snprintf(name, sizeof(name), "l%d_scales", i);
            model.conv2d_layers[i].scales = ggml_get_tensor(model.ctx, name);
            snprintf(name, sizeof(name), "l%d_rolling_mean", i);
            model.conv2d_layers[i].rolling_mean = ggml_get_tensor(model.ctx, name);
            snprintf(name, sizeof(name), "l%d_rolling_variance", i);
            model.conv2d_layers[i].rolling_variance = ggml_get_tensor(model.ctx, name);
        }
    }
    return true;
}